

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall FNodeBuilder::GroupSegPlanesSimple(FNodeBuilder *this)

{
  ulong uVar1;
  uint *puVar2;
  FSimpleVert FVar3;
  int iVar4;
  FPrivSeg *pFVar5;
  FPrivVert *pFVar6;
  FSimpleVert FVar7;
  fixed_t *pfVar8;
  uint amount;
  FPrivSeg **ppFVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar12 = (this->Segs).Count;
  puVar2 = &(this->Planes).Count;
  amount = uVar12 - *puVar2;
  uVar11 = uVar12;
  if (*puVar2 <= uVar12 && amount != 0) {
    TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Grow(&this->Planes,amount);
    uVar11 = (this->Segs).Count;
  }
  (this->Planes).Count = uVar12;
  pFVar5 = (this->Segs).Array;
  if (0 < (int)uVar11) {
    pFVar6 = (this->Vertices).Array;
    ppFVar9 = &pFVar5->hashnext;
    pfVar8 = &((this->Planes).Array)->dx;
    uVar10 = 0;
    do {
      uVar1 = uVar10 + 1;
      *(DWORD *)(ppFVar9 + -4) = (DWORD)uVar1;
      *ppFVar9 = (FPrivSeg *)0x0;
      *(int *)(ppFVar9 + -1) = (int)uVar10;
      *(bool *)((long)ppFVar9 + -4) = true;
      iVar4 = *(int *)((long)ppFVar9 + -0x3c);
      FVar7 = pFVar6[((FPrivSeg *)(ppFVar9 + -8))->v1].super_FSimpleVert;
      ((FSimpleLine *)(pfVar8 + -2))->x = FVar7.x;
      ((FSimpleLine *)(pfVar8 + -2))->y = FVar7.y;
      FVar3 = pFVar6[iVar4].super_FSimpleVert;
      *(ulong *)pfVar8 = CONCAT44(FVar3.y - FVar7.y,FVar3.x - FVar7.x);
      ppFVar9 = ppFVar9 + 9;
      pfVar8 = pfVar8 + 4;
      uVar10 = uVar1;
    } while (uVar11 != uVar1);
  }
  pFVar5[uVar11 - 1].next = 0xffffffff;
  uVar12 = uVar11 + 7 >> 3;
  TArray<unsigned_char,_unsigned_char>::Grow(&this->PlaneChecked,uVar12);
  puVar2 = &(this->PlaneChecked).Count;
  *puVar2 = *puVar2 + uVar12;
  return;
}

Assistant:

void FNodeBuilder::GroupSegPlanesSimple()
{
	Planes.Resize(Segs.Size());
	for (int i = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		FSimpleLine *pline = &Planes[i];
		seg->next = i+1;
		seg->hashnext = NULL;
		seg->planenum = i;
		seg->planefront = true;
		pline->x = Vertices[seg->v1].x;
		pline->y = Vertices[seg->v1].y;
		pline->dx = Vertices[seg->v2].x - Vertices[seg->v1].x;
		pline->dy = Vertices[seg->v2].y - Vertices[seg->v1].y;
	}
	Segs.Last().next = DWORD_MAX;
	PlaneChecked.Reserve((Segs.Size() + 7) / 8);
}